

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_4,_4>,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_>::call
          (binary<tcu::Matrix<double,_4,_4>,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  GLuint GVar6;
  undefined8 *puVar7;
  int row_1;
  undefined8 *puVar8;
  GLdouble *data;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 *puVar12;
  uint uVar13;
  Matrix<double,_4,_4> result;
  undefined8 local_168 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a0 [128];
  
  puVar8 = local_168;
  puVar7 = local_168;
  lVar11 = 0;
  GVar6 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar2 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  local_168[0xe] = 0;
  local_168[0xf] = 0;
  local_168[0xc] = 0;
  local_168[0xd] = 0;
  local_168[10] = 0;
  local_168[0xb] = 0;
  local_168[8] = 0;
  local_168[9] = 0;
  local_168[6] = 0;
  local_168[7] = 0;
  local_168[4] = 0;
  local_168[5] = 0;
  local_168[2] = 0;
  local_168[3] = 0;
  local_168[0] = 0;
  local_168[1] = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar13 = 0x3ff00000;
      if (lVar11 != lVar10) {
        uVar13 = 0;
      }
      *(ulong *)((long)puVar8 + lVar10) = (ulong)uVar13 << 0x20;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x80);
    lVar9 = lVar9 + 1;
    puVar8 = (undefined8 *)((long)puVar8 + 8);
    lVar11 = lVar11 + 0x20;
  } while (lVar9 != 4);
  local_c8 = *argument_src;
  uStack_c0 = *(undefined8 *)((long)argument_src + 8);
  local_b8 = *(undefined8 *)((long)argument_src + 0x10);
  uStack_b0 = *(undefined8 *)((long)argument_src + 0x18);
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar6);
  local_e8 = *puVar1;
  uStack_e4 = puVar1[1];
  uStack_e0 = puVar1[2];
  uStack_dc = puVar1[3];
  puVar1 = (undefined4 *)((long)argument_src + (ulong)GVar6 + 0x10);
  local_d8 = *puVar1;
  uStack_d4 = puVar1[1];
  uStack_d0 = puVar1[2];
  uStack_cc = puVar1[3];
  puVar12 = local_a0;
  (*pcVar2)(puVar12);
  lVar9 = 0;
  do {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)puVar7 + lVar11) = *(undefined8 *)(puVar12 + lVar11);
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x80);
    lVar9 = lVar9 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 8);
    puVar12 = puVar12 + 8;
  } while (lVar9 != 4);
  lVar9 = 0;
  do {
    uVar3 = *(undefined8 *)((long)local_168 + lVar9);
    uVar4 = *(undefined8 *)((long)local_168 + lVar9 + 8);
    uVar5 = *(undefined8 *)((long)local_168 + lVar9 + 0x18);
    puVar7 = (undefined8 *)((long)result_dst + lVar9 + 0x10);
    *puVar7 = *(undefined8 *)((long)local_168 + lVar9 + 0x10);
    puVar7[1] = uVar5;
    *(undefined8 *)((long)result_dst + lVar9) = uVar3;
    ((undefined8 *)((long)result_dst + lVar9))[1] = uVar4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x80);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}